

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cpp
# Opt level: O1

void add_histogram(void *b_,ReduceProxy *srp)

{
  pointer pBVar1;
  mapped_type *bb;
  long lVar2;
  Histogram histogram;
  Histogram local_48;
  BlockID local_30;
  
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  receive_histogram(b_,srp,&local_48);
  pBVar1 = (srp->out_link_).neighbors_.
           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(srp->out_link_).neighbors_.
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3)) {
    lVar2 = 0;
    do {
      local_30 = pBVar1[lVar2];
      bb = std::
           map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
           ::operator[](&(srp->super_Proxy).outgoing_,&local_30);
      diy::Serialization<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::save
                (&bb->super_BinaryBuffer,&local_48);
      lVar2 = lVar2 + 1;
      pBVar1 = (srp->out_link_).neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(srp->out_link_).neighbors_.
                                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1)
                          >> 3));
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_histogram(void* b_, const diy::ReduceProxy& srp)
{
    Histogram histogram;
    receive_histogram(b_, srp, histogram);

    for (int i = 0; i < srp.out_link().size(); ++i)
        srp.enqueue(srp.out_link().target(i), histogram);
}